

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

char * generate_arg_str(sm_ref net)

{
  int iVar1;
  size_t sVar2;
  int *in_RDI;
  size_t len;
  int param_num_1;
  int param_num;
  sm_ref decl;
  int i;
  int arg_count;
  char *arg_types;
  char *arg_str;
  sm_list decls;
  int *local_38;
  uint local_30;
  int local_2c;
  char *local_28;
  char *local_20;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)0x0;
  local_20 = (char *)malloc(4);
  local_28 = (char *)malloc(1);
  local_2c = 0;
  if (*in_RDI == 0) {
    local_18 = *(undefined8 **)(in_RDI + 2);
  }
  *local_20 = '\0';
  for (; local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)local_18[1]) {
    local_38 = (int *)*local_18;
    if (*local_38 == 2) {
      if (local_38[10] != -1) {
        iVar1 = local_38[10];
        if (local_2c <= iVar1) {
          local_28 = (char *)realloc(local_28,(long)(iVar1 + 1));
          memset(local_28 + local_2c,0xff,(long)(iVar1 - local_2c));
          local_2c = iVar1 + 1;
        }
        local_28[iVar1] = (char)local_38[0x1b];
      }
    }
    else if (*local_38 == 0x12) {
      for (; *local_38 == 0x12; local_38 = *(int **)(local_38 + 6)) {
      }
      if (local_38[10] != -1) {
        iVar1 = local_38[10];
        if (local_2c <= iVar1) {
          local_28 = (char *)realloc(local_28,(long)(iVar1 + 1));
          memset(local_28 + local_2c,0xff,(long)(iVar1 - local_2c));
          local_2c = iVar1 + 1;
        }
        local_28[iVar1] = '\b';
      }
    }
  }
  if ((local_2c == 1) && (*local_28 == '\v')) {
    local_2c = 0;
  }
  local_30 = 0;
  while( true ) {
    if (local_2c <= (int)local_30) {
      free(local_28);
      return local_20;
    }
    if (local_28[(int)local_30] == -1) break;
    sVar2 = strlen(local_20);
    sVar2 = sVar2 + 8;
    local_20 = (char *)realloc(local_20,sVar2);
    strncat(local_20,"%",sVar2);
    strncat(local_20,arg_type_str[local_28[(int)local_30]],sVar2);
    local_30 = local_30 + 1;
  }
  printf("Arg %d not declared\n",(ulong)local_30);
  return local_20;
}

Assistant:

char *
generate_arg_str(sm_ref net)
{
    sm_list decls = NULL;
    char *arg_str = malloc(4);  /* 4 makes valgrind happier */
    signed char *arg_types = malloc(1);
    int arg_count = 0;
    int i;
    if (net->node_type == cod_compound_statement) {
	decls = net->node.compound_statement.decls;
    }
    arg_str[0] = 0;
    while (decls != NULL) {
	sm_ref decl = decls->node;
	
	if (decl->node_type == cod_declaration) {
	    if (decl->node.declaration.param_num != -1) {
		/* parameter */
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = decl->node.declaration.cg_type;
	    }
	} else if (decl->node_type == cod_array_type_decl) {
	    while(decl->node_type == cod_array_type_decl)
		decl = decl->node.array_type_decl.element_ref;
	    if (decl->node.declaration.param_num != -1) {
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = DILL_P;
	    }
	}
	    
	decls = decls->next;
    }
    if ((arg_count == 1) && (arg_types[0] == DILL_V)) {
	arg_count = 0;
    }
    for (i = 0; i < arg_count ; i++) {
	size_t len;
	if (arg_types[i] == -1) {
	    printf("Arg %d not declared\n", i);
	    return arg_str;
	}
	len = strlen(arg_str) + 8;
	arg_str = realloc(arg_str, len);
	strncat(arg_str, "%", len);
	strncat(arg_str, arg_type_str[arg_types[i]], len);
    }
    free(arg_types);
    return arg_str;
}